

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

void t42_parser_done(T42_Parser parser)

{
  FT_Memory memory;
  T42_Parser parser_local;
  
  if (parser->in_memory == '\0') {
    ft_mem_free((parser->root).memory,parser->base_dict);
    parser->base_dict = (FT_Byte *)0x0;
  }
  if ((parser->root).funcs.done != (_func_void_PS_Parser *)0x0) {
    (*(parser->root).funcs.done)(&parser->root);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t42_parser_done( T42_Parser  parser )
  {
    FT_Memory  memory = parser->root.memory;


    /* free the base dictionary only when we have a disk stream */
    if ( !parser->in_memory )
      FT_FREE( parser->base_dict );

    if ( parser->root.funcs.done )
      parser->root.funcs.done( &parser->root );
  }